

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFFLoader.h
# Opt level: O0

void __thiscall Assimp::NFFImporter::MeshInfo::MeshInfo(MeshInfo *this,MeshInfo *param_1)

{
  MeshInfo *param_1_local;
  MeshInfo *this_local;
  
  ShadingInfo::ShadingInfo(&this->shader,&param_1->shader);
  memcpy(&this->pType,&param_1->pType,0xac);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::vector
            (&this->vertices,&param_1->vertices);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::vector
            (&this->normals,&param_1->normals);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::vector
            (&this->uvs,&param_1->uvs);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->faces,&param_1->faces);
  std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::vector
            (&this->colors,&param_1->colors);
  this->matIndex = param_1->matIndex;
  return;
}

Assistant:

MeshInfo(PatchType _pType, bool bL = false)
            : pType     (_pType)
            , bLocked   (bL)
            , radius    (1.f,1.f,1.f)
            , dir       (0.f,1.f,0.f)
            , matIndex  (0)
        {
            name[0] = '\0'; // by default meshes are unnamed
        }